

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O0

void __thiscall FfsParser::outputInfo(FfsParser *this)

{
  uchar *puVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  char *pcVar4;
  ostream *poVar5;
  uchar *puVar6;
  reference pvVar7;
  reference pvVar8;
  undefined1 local_78 [8];
  CBString secInfo;
  size_t i_1;
  vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
  fitTable;
  ulong local_30;
  size_t i;
  vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  messages;
  FfsParser *this_local;
  
  messages.
  super__Vector_base<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  getMessages((vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
               *)&i,this);
  for (local_30 = 0;
      sVar3 = std::
              vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
              ::size((vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
                      *)&i), local_30 < sVar3; local_30 = local_30 + 1) {
    this_00 = std::
              vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
              ::operator[]((vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
                            *)&i,local_30);
    pcVar4 = Bstrlib::CBString::toLocal8Bit(&this_00->first);
    poVar5 = std::operator<<((ostream *)&std::cout,pcVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  getFitTable((vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
               *)&i_1,this);
  sVar3 = std::
          vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
          ::size((vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                  *)&i_1);
  if (sVar3 != 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "     Address      |   Size    |  Ver  | CS  |          Type / Info          "
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    for (secInfo.super_tagbstring.data = (uchar *)0x0; puVar1 = secInfo.super_tagbstring.data,
        puVar6 = (uchar *)std::
                          vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                          ::size((vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                                  *)&i_1), puVar1 < puVar6;
        secInfo.super_tagbstring.data = secInfo.super_tagbstring.data + 1) {
      pvVar7 = std::
               vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
               ::operator[]((vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                             *)&i_1,(size_type)secInfo.super_tagbstring.data);
      pvVar8 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::operator[]
                         (&pvVar7->first,0);
      pcVar4 = Bstrlib::CBString::toLocal8Bit(pvVar8);
      poVar5 = std::operator<<((ostream *)&std::cout,pcVar4);
      poVar5 = std::operator<<(poVar5," | ");
      pvVar7 = std::
               vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
               ::operator[]((vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                             *)&i_1,(size_type)secInfo.super_tagbstring.data);
      pvVar8 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::operator[]
                         (&pvVar7->first,1);
      pcVar4 = Bstrlib::CBString::toLocal8Bit(pvVar8);
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5," | ");
      pvVar7 = std::
               vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
               ::operator[]((vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                             *)&i_1,(size_type)secInfo.super_tagbstring.data);
      pvVar8 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::operator[]
                         (&pvVar7->first,2);
      pcVar4 = Bstrlib::CBString::toLocal8Bit(pvVar8);
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5," | ");
      pvVar7 = std::
               vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
               ::operator[]((vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                             *)&i_1,(size_type)secInfo.super_tagbstring.data);
      pvVar8 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::operator[]
                         (&pvVar7->first,3);
      pcVar4 = Bstrlib::CBString::toLocal8Bit(pvVar8);
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5," | ");
      pvVar7 = std::
               vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
               ::operator[]((vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                             *)&i_1,(size_type)secInfo.super_tagbstring.data);
      pvVar8 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::operator[]
                         (&pvVar7->first,4);
      pcVar4 = Bstrlib::CBString::toLocal8Bit(pvVar8);
      poVar5 = std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<(poVar5," | ");
      pvVar7 = std::
               vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
               ::operator[]((vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
                             *)&i_1,(size_type)secInfo.super_tagbstring.data);
      pvVar8 = std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::operator[]
                         (&pvVar7->first,5);
      pcVar4 = Bstrlib::CBString::toLocal8Bit(pvVar8);
      poVar5 = std::operator<<(poVar5,pcVar4);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  getSecurityInfo((CBString *)local_78,this);
  bVar2 = Bstrlib::CBString::isEmpty((CBString *)local_78);
  if (!bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"Security Info");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "---------------------------------------------------------------------------"
                            );
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar4 = Bstrlib::CBString::toLocal8Bit((CBString *)local_78);
    poVar5 = std::operator<<((ostream *)&std::cout,pcVar4);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  Bstrlib::CBString::~CBString((CBString *)local_78);
  std::
  vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
  ::~vector((vector<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>,_std::allocator<std::pair<std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>,_UModelIndex>_>_>
             *)&i_1);
  std::
  vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
  ::~vector((vector<std::pair<Bstrlib::CBString,_UModelIndex>,_std::allocator<std::pair<Bstrlib::CBString,_UModelIndex>_>_>
             *)&i);
  return;
}

Assistant:

void FfsParser::outputInfo(void) {
    // Show ffsParser's messages
    std::vector<std::pair<UString, UModelIndex> > messages = getMessages();
    for (size_t i = 0; i < messages.size(); i++) {
        std::cout << (const char *)messages[i].first.toLocal8Bit() << std::endl;
    }
    
    // Get last VTF
    std::vector<std::pair<std::vector<UString>, UModelIndex > > fitTable = getFitTable();
    if (fitTable.size()) {
        std::cout << "---------------------------------------------------------------------------" << std::endl;
        std::cout << "     Address      |   Size    |  Ver  | CS  |          Type / Info          " << std::endl;
        std::cout << "---------------------------------------------------------------------------" << std::endl;
        for (size_t i = 0; i < fitTable.size(); i++) {
            std::cout
            << (const char *)fitTable[i].first[0].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[1].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[2].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[3].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[4].toLocal8Bit() << " | "
            << (const char *)fitTable[i].first[5].toLocal8Bit() << std::endl;
        }
    }
    
    // Get security info
    UString secInfo = getSecurityInfo();
    if (!secInfo.isEmpty()) {
        std::cout << "---------------------------------------------------------------------------"  << std::endl;
        std::cout << "Security Info" << std::endl;
        std::cout << "---------------------------------------------------------------------------"  << std::endl;
        std::cout << (const char *)secInfo.toLocal8Bit() << std::endl;
    }
}